

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *tm)

{
  byte *pbVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  size_t len;
  ulong local_28;
  
  puVar2 = *p;
  local_28 = (long)end - (long)puVar2;
  if ((long)local_28 < 1) {
    return -0x2460;
  }
  if (*puVar2 == '\x17') {
    lVar8 = 2;
    bVar3 = true;
  }
  else {
    if (*puVar2 != '\x18') {
      return -0x2462;
    }
    lVar8 = 4;
    bVar3 = false;
  }
  *p = puVar2 + 1;
  iVar4 = mbedtls_asn1_get_len(p,end,&local_28);
  if (iVar4 == 0) {
    iVar4 = -0x2400;
    uVar5 = local_28 - (lVar8 + 8U);
    if (lVar8 + 8U <= local_28) {
      tm->year = 0;
      puVar2 = *p;
      lVar7 = 0;
      do {
        bVar6 = puVar2[lVar7] - 0x30;
        if (9 < bVar6) {
          iVar4 = -0x2400;
          goto LAB_0010d08a;
        }
        pbVar1 = puVar2 + lVar7;
        iVar4 = tm->year * 10;
        tm->year = iVar4;
        *p = pbVar1 + 1;
        tm->year = (uint)*pbVar1 + iVar4 + -0x30;
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
      iVar4 = 0;
LAB_0010d08a:
      if (bVar6 < 10) {
        if (bVar3) {
          if (tm->year < 0x32) {
            tm->year = tm->year + 100;
          }
          tm->year = tm->year + 0x76c;
        }
        tm->mon = 0;
        puVar2 = *p;
        lVar8 = 0;
        do {
          bVar6 = puVar2[lVar8] - 0x30;
          if (9 < bVar6) {
            iVar4 = -0x2400;
            goto LAB_0010d0f9;
          }
          pbVar1 = puVar2 + lVar8;
          iVar4 = tm->mon * 10;
          tm->mon = iVar4;
          *p = pbVar1 + 1;
          tm->mon = (uint)*pbVar1 + iVar4 + -0x30;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 2);
        iVar4 = 0;
LAB_0010d0f9:
        if (bVar6 < 10) {
          tm->day = 0;
          puVar2 = *p;
          lVar8 = 0;
          do {
            bVar6 = puVar2[lVar8] - 0x30;
            if (9 < bVar6) {
              iVar4 = -0x2400;
              goto LAB_0010d151;
            }
            pbVar1 = puVar2 + lVar8;
            iVar4 = tm->day * 10;
            tm->day = iVar4;
            *p = pbVar1 + 1;
            tm->day = (uint)*pbVar1 + iVar4 + -0x30;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 2);
          iVar4 = 0;
LAB_0010d151:
          if (bVar6 < 10) {
            tm->hour = 0;
            puVar2 = *p;
            lVar8 = 0;
            do {
              bVar6 = puVar2[lVar8] - 0x30;
              if (9 < bVar6) {
                iVar4 = -0x2400;
                goto LAB_0010d1a9;
              }
              pbVar1 = puVar2 + lVar8;
              iVar4 = tm->hour * 10;
              tm->hour = iVar4;
              *p = pbVar1 + 1;
              tm->hour = (uint)*pbVar1 + iVar4 + -0x30;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 2);
            iVar4 = 0;
LAB_0010d1a9:
            if (bVar6 < 10) {
              tm->min = 0;
              puVar2 = *p;
              lVar8 = 0;
              do {
                bVar6 = puVar2[lVar8] - 0x30;
                if (9 < bVar6) {
                  iVar4 = -0x2400;
                  goto LAB_0010d201;
                }
                pbVar1 = puVar2 + lVar8;
                iVar4 = tm->min * 10;
                tm->min = iVar4;
                *p = pbVar1 + 1;
                tm->min = (uint)*pbVar1 + iVar4 + -0x30;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 2);
              iVar4 = 0;
LAB_0010d201:
              if ((bVar6 < 10) && (iVar4 = -0x2400, 1 < uVar5)) {
                tm->sec = 0;
                puVar2 = *p;
                lVar8 = 0;
                do {
                  bVar6 = puVar2[lVar8] - 0x30;
                  if (9 < bVar6) {
                    iVar4 = -0x2400;
                    goto LAB_0010d268;
                  }
                  pbVar1 = puVar2 + lVar8;
                  iVar4 = tm->sec * 10;
                  tm->sec = iVar4;
                  *p = pbVar1 + 1;
                  tm->sec = (uint)*pbVar1 + iVar4 + -0x30;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 2);
                iVar4 = 0;
LAB_0010d268:
                if (bVar6 < 10) {
                  lVar8 = uVar5 - 2;
                  if (lVar8 == 1) {
                    lVar8 = 1;
                    if (**p == 'Z') {
                      *p = *p + 1;
                      lVar8 = 0;
                    }
                  }
                  iVar4 = -0x2400;
                  if (lVar8 == 0) {
                    iVar4 = x509_date_is_valid(tm);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    iVar4 = iVar4 + -0x2400;
  }
  return iVar4;
}

Assistant:

int mbedtls_x509_get_time( unsigned char **p, const unsigned char *end,
                           mbedtls_x509_time *tm )
{
    int ret;
    size_t len, year_len;
    unsigned char tag;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag = **p;

    if( tag == MBEDTLS_ASN1_UTC_TIME )
        year_len = 2;
    else if( tag == MBEDTLS_ASN1_GENERALIZED_TIME )
        year_len = 4;
    else
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    (*p)++;
    ret = mbedtls_asn1_get_len( p, end, &len );

    if( ret != 0 )
        return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

    return x509_parse_time( p, len, year_len, tm );
}